

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_functionAnalysisEnvironment_getOrCreateCaptureFor
          (sysbvm_context_t *context,sysbvm_functionAnalysisEnvironment_t *environment,
          sysbvm_tuple_t sourceBinding)

{
  sysbvm_tuple_t ownerFunction;
  _Bool _Var1;
  size_t vectorIndex;
  sysbvm_tuple_t element;
  sysbvm_tuple_t capturedBinding;
  sysbvm_tuple_t local_30;
  
  element = *(sysbvm_tuple_t *)(sourceBinding + 0x10);
  if (*(sysbvm_tuple_t *)(sourceBinding + 0x10) == 0) {
    element = sourceBinding;
  }
  _Var1 = sysbvm_identityDictionary_find(environment->captureBindingTable,element,&local_30);
  if (!_Var1) {
    ownerFunction = environment->functionDefinition;
    vectorIndex = sysbvm_orderedCollection_getSize(environment->captureBindingList);
    local_30 = sysbvm_symbolCaptureBinding_create(context,sourceBinding,ownerFunction,vectorIndex);
    sysbvm_identityDictionary_atPut(context,environment->captureBindingTable,element,local_30);
    sysbvm_orderedCollection_add(context,environment->captureBindingList,local_30);
  }
  return local_30;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionAnalysisEnvironment_getOrCreateCaptureFor(sysbvm_context_t *context, sysbvm_functionAnalysisEnvironment_t *environment, sysbvm_tuple_t sourceBinding)
{
    sysbvm_tuple_t capturedBinding;
    sysbvm_symbolBinding_t *sourceBindingObject = (sysbvm_symbolBinding_t*)sourceBinding;
    sysbvm_tuple_t capturedBindingKey = sourceBindingObject->super.name ? sourceBindingObject->super.name : sourceBinding;
    if(sysbvm_identityDictionary_find(environment->captureBindingTable, capturedBindingKey, &capturedBinding))
        return capturedBinding;

    capturedBinding = sysbvm_symbolCaptureBinding_create(context, sourceBinding, environment->functionDefinition, sysbvm_orderedCollection_getSize(environment->captureBindingList));
    sysbvm_identityDictionary_atPut(context, environment->captureBindingTable, capturedBindingKey, capturedBinding);
    sysbvm_orderedCollection_add(context, environment->captureBindingList, capturedBinding);
    return capturedBinding;
}